

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput.cpp
# Opt level: O2

int __thiscall
ncnn::Yolov3DetectionOutput::forward
          (Yolov3DetectionOutput *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  undefined8 uVar2;
  size_t sVar3;
  void *pvVar4;
  ulong uVar5;
  Mat *this_00;
  uint uVar6;
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  float *pfVar12;
  ulong uVar13;
  ulong uVar14;
  pointer pBVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  float *pfVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  Yolov3DetectionOutput *this_01;
  pointer pMVar26;
  int i;
  int iVar27;
  ulong uVar28;
  float *pfVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float extraout_XMM0_Db;
  undefined1 auVar35 [16];
  float extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  bbox_rects;
  float *local_158;
  float *local_150;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  all_bbox_rects;
  float local_78;
  float fStack_74;
  
  all_bbox_rects.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  all_bbox_rects.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  all_bbox_rects.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar25 = 0;
  do {
    if ((ulong)(((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start) / 0x48) <= uVar25) {
      this_01 = this;
      qsort_descent_inplace(this,&all_bbox_rects);
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      nms_sorted_bboxes(this_01,&all_bbox_rects,&picked,this->nms_threshold);
      bbox_rects.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      bbox_rects.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      bbox_rects.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      for (uVar25 = 0;
          uVar25 < (ulong)((long)picked.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)picked.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3); uVar25 = uVar25 + 1
          ) {
        std::
        vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
        ::push_back(&bbox_rects,
                    all_bbox_rects.
                    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ._M_impl.super__Vector_impl_data._M_start +
                    picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                    .super__Vector_impl_data._M_start[uVar25]);
      }
      uVar25 = ((long)bbox_rects.
                      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)bbox_rects.
                     super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x1c;
      iVar27 = (int)uVar25;
      if (iVar27 == 0) {
        iVar11 = 0;
      }
      else {
        this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        Mat::create(this_00,6,iVar27,4,opt->blob_allocator);
        pvVar4 = this_00->data;
        iVar11 = -100;
        if ((pvVar4 != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
          iVar11 = 0;
          uVar25 = uVar25 & 0xffffffff;
          if (iVar27 < 1) {
            uVar25 = 0;
          }
          pBVar15 = bbox_rects.
                    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          for (uVar19 = 0; uVar25 != uVar19; uVar19 = uVar19 + 1) {
            fVar1 = pBVar15->score;
            lVar23 = (long)this_00->w * uVar19 * this_00->elemsize;
            *(float *)((long)pvVar4 + lVar23) = (float)pBVar15->label + 1.0;
            *(float *)((long)pvVar4 + lVar23 + 4) = fVar1;
            *(float *)((long)pvVar4 + lVar23 + 8) = pBVar15->xmin;
            *(float *)((long)pvVar4 + lVar23 + 0xc) = pBVar15->ymin;
            *(float *)((long)pvVar4 + lVar23 + 0x10) = pBVar15->xmax;
            *(float *)((long)pvVar4 + lVar23 + 0x14) = pBVar15->ymax;
            pBVar15 = pBVar15 + 1;
          }
        }
      }
      std::
      _Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ::~_Vector_base(&bbox_rects.
                       super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                     );
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
LAB_003fff4c:
      std::
      _Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ::~_Vector_base(&all_bbox_rects.
                       super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                     );
      return iVar11;
    }
    bbox_rects.
    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    bbox_rects.
    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    bbox_rects.
    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ::resize((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
              *)&bbox_rects,(long)this->num_box);
    pMVar26 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    iVar27 = this->num_box;
    iVar11 = pMVar26[uVar25].c / iVar27;
    if (iVar11 != this->num_class + 5) {
      std::
      vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ::~vector((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                 *)&bbox_rects);
      iVar11 = -1;
      goto LAB_003fff4c;
    }
    pMVar26 = pMVar26 + uVar25;
    lVar23 = (long)iVar27;
    uVar19._0_4_ = pMVar26->w;
    uVar19._4_4_ = pMVar26->h;
    fVar1 = *(float *)((long)(this->anchors_scale).data + uVar25 * 4);
    uVar24 = uVar19 & 0xffffffff;
    if ((int)(undefined4)uVar19 < 1) {
      uVar24 = 0;
    }
    uVar6 = uVar19._4_4_;
    if ((int)uVar19._4_4_ < 1) {
      uVar6 = 0;
    }
    auVar35._4_4_ = (float)(int)uVar19._4_4_;
    auVar35._0_4_ = (float)(int)(undefined4)uVar19;
    auVar35._8_4_ = 0x3f000000;
    auVar35._12_4_ = 0x3f000000;
    auVar35 = divps(_DAT_005397e0,auVar35);
    for (lVar16 = 0; lVar16 < iVar27; lVar16 = lVar16 + 1) {
      lVar20 = lVar16 * iVar11;
      sVar3 = pMVar26->cstep;
      pvVar4 = pMVar26->data;
      uVar5 = pMVar26->elemsize;
      lVar17 = (long)pMVar26->w * uVar5;
      uVar28 = (long)pMVar26->d * (long)pMVar26->h * lVar17 + 0xfU & 0xfffffffffffffff0;
      uVar2 = *(undefined8 *)
               ((long)(this->biases).data +
               (long)((int)*(float *)((long)(this->mask).data + lVar16 * 4 + lVar23 * uVar25 * 4) *
                     2) * 4);
      local_150 = (float *)(sVar3 * lVar20 * uVar5 + (long)pvVar4);
      local_158 = (float *)((lVar20 + 1) * sVar3 * uVar5 + (long)pvVar4);
      pfVar21 = (float *)((lVar20 + 2) * sVar3 * uVar5 + (long)pvVar4);
      pfVar12 = (float *)((lVar20 + 3) * sVar3 * uVar5 + (long)pvVar4);
      pfVar29 = (float *)((lVar20 + 4) * sVar3 * uVar5 + (long)pvVar4);
      for (uVar14 = 0; uVar14 != uVar6; uVar14 = uVar14 + 1) {
        for (uVar22 = 0; uVar22 != uVar24; uVar22 = uVar22 + 1) {
          uVar18 = 0;
          uVar13 = (ulong)(uint)this->num_class;
          if (this->num_class < 1) {
            uVar13 = uVar18;
          }
          fVar31 = -3.4028235e+38;
          for (; uVar13 != uVar18; uVar18 = uVar18 + 1) {
            fVar30 = *(float *)((long)pvVar4 +
                               (uVar28 - uVar28 % uVar5) * uVar18 +
                               uVar22 * 4 + lVar17 * uVar14 + (lVar20 + 5) * sVar3 * uVar5);
            if (fVar31 <= fVar30) {
              fVar31 = fVar30;
            }
          }
          fVar30 = expf(-*pfVar29);
          fVar31 = expf(-fVar31);
          fVar31 = 1.0 / ((fVar31 + 1.0) * fVar30 + 1.0);
          if (this->confidence_threshold <= fVar31) {
            fVar30 = *local_158;
            fVar32 = expf(-*local_150);
            fVar30 = expf(-fVar30);
            fVar33 = expf(*pfVar21);
            fVar34 = expf(*pfVar12);
            auVar7._8_4_ = extraout_XMM0_Db_01;
            auVar7._4_4_ = fVar33;
            auVar7._0_4_ = extraout_XMM0_Db_02;
            auVar36._0_8_ = auVar7._0_8_ << 0x20;
            auVar36._8_4_ = fVar33;
            auVar36._12_4_ = fVar34;
            auVar10._8_8_ = uVar2;
            auVar10._0_8_ = 0x3f8000003f800000;
            auVar9._4_4_ = fVar30 + 1.0;
            auVar9._0_4_ = fVar32 + 1.0;
            auVar9._8_4_ = extraout_XMM0_Db + 0.0;
            auVar9._12_4_ = extraout_XMM0_Db_00 + 0.0;
            auVar39 = divps(auVar10,auVar9);
            auVar8._4_8_ = auVar36._8_8_;
            auVar8._0_4_ = extraout_XMM0_Db_02 * 1.0;
            auVar37._0_8_ = auVar8._0_8_ << 0x20;
            auVar37._8_4_ = fVar33 * (float)uVar2;
            auVar37._12_4_ = fVar34 * (float)((ulong)uVar2 >> 0x20);
            auVar38._8_8_ = auVar37._8_8_;
            auVar38._0_8_ = auVar39._0_8_;
            local_78 = auVar35._0_4_;
            fStack_74 = auVar35._4_4_;
            local_78 = (auVar39._0_4_ + (float)(int)uVar22) * local_78;
            fStack_74 = (auVar39._4_4_ + (float)(int)uVar14) * fStack_74;
            auVar39._4_4_ = (float)(int)uVar14;
            auVar39._0_4_ = (float)(int)uVar22;
            auVar39._8_4_ = (float)(int)(fVar1 * (float)(int)(undefined4)uVar19);
            auVar39._12_4_ = (float)(int)(fVar1 * (float)(int)uVar19._4_4_);
            auVar39 = divps(auVar38,auVar39);
            fVar30 = auVar39._8_4_ * 0.5;
            fVar32 = auVar39._12_4_ * 0.5;
            picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)CONCAT44(local_78 - fVar30,fVar31);
            picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 (pointer)CONCAT44(local_78 + fVar30,fStack_74 - fVar32);
            picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)CONCAT44(auVar39._8_4_ * auVar39._12_4_,fStack_74 + fVar32);
            std::
            vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
            ::push_back((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                         *)(&(bbox_rects.
                              super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                              ._M_impl.super__Vector_impl_data._M_start)->score + lVar16 * 6),
                        (value_type *)&picked);
          }
          local_150 = local_150 + 1;
          local_158 = local_158 + 1;
          pfVar21 = pfVar21 + 1;
          pfVar12 = pfVar12 + 1;
          pfVar29 = pfVar29 + 1;
        }
      }
      iVar27 = this->num_box;
    }
    lVar23 = 8;
    for (lVar16 = 0; lVar16 < iVar27; lVar16 = lVar16 + 1) {
      std::
      vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
      ::
      insert<__gnu_cxx::__normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect_const*,std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>>,void>
                ((vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                  *)&all_bbox_rects,
                 (const_iterator)
                 all_bbox_rects.
                 super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 *(BBoxRect **)
                  ((long)bbox_rects.
                         super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar23 + -8),
                 *(BBoxRect **)
                  ((long)&(bbox_rects.
                           super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                           ._M_impl.super__Vector_impl_data._M_start)->score + lVar23));
      iVar27 = this->num_box;
      lVar23 = lVar23 + 0x18;
    }
    std::
    vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ::~vector((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
               *)&bbox_rects);
    uVar25 = uVar25 + 1;
  } while( true );
}

Assistant:

int Yolov3DetectionOutput::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;

    for (size_t b = 0; b < bottom_blobs.size(); b++)
    {
        std::vector<std::vector<BBoxRect> > all_box_bbox_rects;
        all_box_bbox_rects.resize(num_box);
        const Mat& bottom_top_blobs = bottom_blobs[b];

        int w = bottom_top_blobs.w;
        int h = bottom_top_blobs.h;
        int channels = bottom_top_blobs.c;
        //printf("%d %d %d\n", w, h, channels);
        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;
        size_t mask_offset = b * num_box;
        int net_w = (int)(anchors_scale[b] * w);
        int net_h = (int)(anchors_scale[b] * h);
        //printf("%d %d\n", net_w, net_h);

        //printf("%d %d %d\n", w, h, channels);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;
            int biases_index = static_cast<int>(mask[pp + mask_offset]);
            //printf("%d\n", biases_index);
            const float bias_w = biases[biases_index * 2];
            const float bias_h = biases[biases_index * 2 + 1];
            //printf("%f %f\n", bias_w, bias_h);
            const float* xptr = bottom_top_blobs.channel(p);
            const float* yptr = bottom_top_blobs.channel(p + 1);
            const float* wptr = bottom_top_blobs.channel(p + 2);
            const float* hptr = bottom_top_blobs.channel(p + 3);

            const float* box_score_ptr = bottom_top_blobs.channel(p + 4);

            // softmax class scores
            Mat scores = bottom_top_blobs.channel_range(p + 5, num_class);
            //softmax->forward_inplace(scores, opt);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    // find class index with max class score
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }

                    //sigmoid(box_score) * sigmoid(class_score)
                    float confidence = 1.f / ((1.f + expf(-box_score_ptr[0]) * (1.f + expf(-class_score))));
                    if (confidence >= confidence_threshold)
                    {
                        // region box
                        float bbox_cx = (j + sigmoid(xptr[0])) / w;
                        float bbox_cy = (i + sigmoid(yptr[0])) / h;
                        float bbox_w = expf(wptr[0]) * bias_w / net_w;
                        float bbox_h = expf(hptr[0]) * bias_h / net_h;

                        float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                        float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                        float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                        float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                        float area = bbox_w * bbox_h;

                        BBoxRect c = {confidence, bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, area, class_index};
                        all_box_bbox_rects[pp].push_back(c);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = r.score;
        float* outptr = top_blob.row(i);

        outptr[0] = r.label + 1.0f; // +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}